

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

char * __thiscall kj::Vector<char>::add<int>(Vector<char> *this,int *params)

{
  bool bVar1;
  int *params_00;
  char *pcVar2;
  int *params_local;
  Vector<char> *this_local;
  
  bVar1 = ArrayBuilder<char>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  params_00 = fwd<int>(params);
  pcVar2 = ArrayBuilder<char>::add<int>(&this->builder,params_00);
  return pcVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }